

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTSynthetic.cpp
# Opt level: O2

bool __thiscall SyntheticConnection::ProcessFetchedData(SyntheticConnection *this)

{
  _Base_ptr *this_00;
  int iVar1;
  time_t tVar2;
  iterator __position;
  mapped_type *this_01;
  double dVar3;
  undefined1 local_118 [32];
  _Base_ptr local_f8;
  double local_f0;
  double dStack_e8;
  double local_e0;
  LTChannel *local_d8;
  unique_lock<std::mutex> mapLock;
  positionTy local_c0;
  positionTy posCam;
  
  tVar2 = time((time_t *)0x0);
  DataRefs::GetViewPos();
  iVar1 = dataRefs.fdStdDistance * 0x73c;
  __position._M_node = mapSynData._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    while( true ) {
      if ((_Rb_tree_header *)__position._M_node == &mapSynData._M_t._M_impl.super__Rb_tree_header) {
        return true;
      }
      this_00 = &__position._M_node[0xf]._M_parent;
      dVar3 = positionTy::distRoughSqr((positionTy *)this_00,&posCam);
      if (dVar3 <= (double)iVar1 * (double)iVar1) break;
      __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
    }
    std::unique_lock<std::mutex>::unique_lock(&mapLock,&mapFdMutex);
    this_01 = std::
              map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
              ::operator[](&mapFd,(key_type *)(__position._M_node + 1));
    std::unique_lock<std::mutex>::unlock(&mapLock);
    if (NAN((double)__position._M_node[0x10]._M_parent)) {
      LTAptFindStartupLoc((positionTy *)local_118,(positionTy *)this_00,NAN,(double *)0x0);
      __position._M_node[0x10]._M_parent = local_f8;
      if (!NAN((double)local_f8)) goto LAB_001811fa;
      __position = std::
                   _Rb_tree<LTFlightData::FDKeyTy,std::pair<LTFlightData::FDKeyTy_const,SyntheticConnection::SynDataTy>,std::_Select1st<std::pair<LTFlightData::FDKeyTy_const,SyntheticConnection::SynDataTy>>,std::less<LTFlightData::FDKeyTy>,std::allocator<std::pair<LTFlightData::FDKeyTy_const,SyntheticConnection::SynDataTy>>>
                   ::erase_abi_cxx11_((_Rb_tree<LTFlightData::FDKeyTy,std::pair<LTFlightData::FDKeyTy_const,SyntheticConnection::SynDataTy>,std::_Select1st<std::pair<LTFlightData::FDKeyTy_const,SyntheticConnection::SynDataTy>>,std::less<LTFlightData::FDKeyTy>,std::allocator<std::pair<LTFlightData::FDKeyTy_const,SyntheticConnection::SynDataTy>>>
                                       *)&mapSynData,__position);
    }
    else {
LAB_001811fa:
      LTFlightData::FDDynamicData::FDDynamicData((FDDynamicData *)local_118);
      local_f0 = 0.0;
      dStack_e8 = 0.0;
      local_118[0x18] = true;
      local_f8 = __position._M_node[0x10]._M_parent;
      *(ushort *)&__position._M_node[0x11].field_0x4 =
           (ushort)*(undefined4 *)&__position._M_node[0x11].field_0x4 & 0xcf00 | 0x1085;
      local_d8 = (LTChannel *)this;
      std::recursive_mutex::lock(&this_01->dataAccessMutex);
      if ((this_01->acKey).key._M_string_length == 0) {
        LTFlightData::SetKey(this_01,(key_type *)(__position._M_node + 1));
        DataRefs::GetViewPos();
        dVar3 = CoordDistance((positionTy *)this_00,&local_c0);
        LTFlightData::UpdateData
                  (this_01,(FDStaticData *)&__position._M_node[2]._M_left,dVar3,DATREQU_NONE);
        local_e0 = (double)tVar2 - (double)dataRefs.fdBufPeriod;
        *(double *)(__position._M_node + 0x10) = local_e0;
        LTFlightData::AddDynData(this_01,(FDDynamicData *)local_118,0,0,(positionTy *)this_00);
        if ((int)dataRefs.iLogLevel < 1) {
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTSynthetic.cpp"
                 ,0xdb,"ProcessFetchedData",logDEBUG,"Created parked aircraft %s",
                 __position._M_node[1]._M_parent);
        }
      }
      local_e0 = (double)tVar2 - (double)(dataRefs.fdCurrRefrIntvl / 2);
      *(double *)(__position._M_node + 0x10) = local_e0;
      LTFlightData::AddDynData(this_01,(FDDynamicData *)local_118,0,0,(positionTy *)this_00);
      __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      pthread_mutex_unlock((pthread_mutex_t *)&this_01->dataAccessMutex);
    }
    std::unique_lock<std::mutex>::~unique_lock(&mapLock);
  } while( true );
}

Assistant:

bool SyntheticConnection::ProcessFetchedData ()
{
    // Timestamp with which we send the data
    const double tNow = (double)std::time(nullptr);
    // Camera pos
    const positionTy posCam = dataRefs.GetViewPos();
    // Squared search distance for distance comparison
    const double distSearchSqr = sqr(double(dataRefs.GetFdStdDistance_m()));
    
    // --- Parked Aircraft ---
    // For all stored aircraft
    // - lookup heading to have them point into the right direction of the startup position
    // - send an dynamic data update for LiveTraffic to process
    for (auto i = mapSynData.begin(); i != mapSynData.end();) {
        const LTFlightData::FDKeyTy& key = i->first;
        SynDataTy& parkDat = i->second;

        // Only process planes in search distance
        // We keep the data in memory, just in case we come back, but we don't feed data for unneeded planes
        if (parkDat.pos.distRoughSqr(posCam) > distSearchSqr) {
            ++i;                                                // next plane
            continue;
        }

        // Find the related flight data
        std::unique_lock<std::mutex> mapLock (mapFdMutex);      // lock the entire map
        LTFlightData& fd = mapFd[key];                          // fetch or create flight data
        mapLock.unlock();                                       // release the map lock
        
        // Haven't yet looked up startup position's heading?
        if (std::isnan(parkDat.pos.heading())) {
            parkDat.pos.heading() = LTAptFindStartupLoc(parkDat.pos).heading();
            // Still have no heading? That means we don't have a startup position...should not happen but does
            if (std::isnan(parkDat.pos.heading()))
            {
                i = mapSynData.erase(i);
                continue;
            }
        }
        
        // Send position for LiveTraffic's processing
        LTFlightData::FDDynamicData dyn;
        dyn.pChannel = this;
        dyn.spd = 0.0;
        dyn.vsi = 0.0;
        dyn.gnd = true;
        dyn.heading = parkDat.pos.heading();
        parkDat.pos.f.specialPos = SPOS_STARTUP;
        parkDat.pos.f.bHeadFixed = true;
        parkDat.pos.f.flightPhase = FPH_PARKED;

        // Update flight data
        std::lock_guard<std::recursive_mutex> fdLock (fd.dataAccessMutex);
        if (fd.key().empty()) {                                 // just created!
            // a/c exists no longer, we re-create it, can happen after disable/enable
            fd.SetKey(key);
            fd.UpdateData(parkDat.stat, parkDat.pos.dist(dataRefs.GetViewPos()));
            // to speed up creation of the actual aircraft we send the position for a past timestamp first
            dyn.ts = parkDat.pos.ts() = tNow - dataRefs.GetFdBufPeriod();
            fd.AddDynData(dyn, 0, 0, &parkDat.pos);
            LOG_MSG(logDEBUG, "Created parked aircraft %s", key.c_str());
        }

        // Add a (nearly) _current_ data item
        // We reduce timestamp a bit so we don't appear better than live stream's data,
        // which can't be current up to the minute
        dyn.ts = parkDat.pos.ts() = tNow - double(dataRefs.GetFdRefreshIntvl()/2);
        fd.AddDynData(dyn, 0, 0, &parkDat.pos);
        
        // next plane
        ++i;
    }
    return true;
}